

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_bio_cf_in_read(BIO *bio,char *buf,int blen)

{
  undefined8 *puVar1;
  Curl_easy *data;
  CURLcode CVar2;
  Curl_cfilter *cf;
  ulong uVar3;
  CURLcode local_34;
  
  cf = (Curl_cfilter *)BIO_get_data();
  puVar1 = *(undefined8 **)((long)cf->ctx + 0x30);
  data = *(Curl_easy **)((long)cf->ctx + 0x38);
  local_34 = CURLE_RECV_ERROR;
  if (buf == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = Curl_conn_cf_recv(cf->next,data,buf,(long)blen,&local_34);
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_bio_cf_in_read(len=%d) -> %d, err=%d",(ulong)(uint)blen,
                        uVar3 & 0xffffffff,(ulong)local_34);
    }
    BIO_clear_flags((BIO *)bio,0xf);
    *(CURLcode *)(puVar1 + 4) = local_34;
    if (local_34 == CURLE_AGAIN && (long)uVar3 < 0) {
      BIO_set_flags((BIO *)bio,9);
    }
    if (*(char *)((long)puVar1 + 0x24) == '\0') {
      CVar2 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar1);
      if (CVar2 == CURLE_OK) {
        *(undefined1 *)((long)puVar1 + 0x24) = 1;
      }
      else {
        *(CURLcode *)(puVar1 + 4) = CVar2;
        uVar3 = 0xffffffffffffffff;
      }
    }
  }
  return (int)uVar3;
}

Assistant:

static int ossl_bio_cf_in_read(BIO *bio, char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nread;
  CURLcode result = CURLE_RECV_ERROR;

  DEBUGASSERT(data);
  /* OpenSSL catches this case, so should we. */
  if(!buf)
    return 0;

  nread = Curl_conn_cf_recv(cf->next, data, buf, blen, &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_in_read(len=%d) -> %d, err=%d",
              blen, (int)nread, result);
  BIO_clear_retry_flags(bio);
  backend->io_result = result;
  if(nread < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_read(bio);
  }

  /* Before returning server replies to the SSL instance, we need
   * to have setup the x509 store or verification will fail. */
  if(!backend->x509_store_setup) {
    result = Curl_ssl_setup_x509_store(cf, data, backend->ctx);
    if(result) {
      backend->io_result = result;
      return -1;
    }
    backend->x509_store_setup = TRUE;
  }

  return (int)nread;
}